

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depth_first_traverser.h
# Opt level: O1

bool __thiscall
draco::
DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
::TraverseFromCorner
          (DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           *this,CornerIndex corner_id)

{
  pointer *ppIVar1;
  ulong *puVar2;
  iterator iVar3;
  CornerTable *pCVar4;
  _Bit_type *p_Var5;
  ulong uVar6;
  MeshAttributeIndicesEncodingData *pMVar7;
  uint uVar8;
  pointer pIVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  CornerIndex right_corner_id;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_40;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_3c;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_38;
  
  if ((corner_id.value_ != 0xffffffff) &&
     ((*(ulong *)((long)(this->
                        super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                        ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                 (ulong)(corner_id.value_ / 0x18 & 0xfffffff8)) >>
       ((ulong)corner_id.value_ / 3 & 0x3f) & 1) == 0)) {
    pIVar9 = (this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar9) {
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar9;
    }
    iVar3._M_current =
         (this->corner_traversal_stack_).
         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_3c.value_ = corner_id.value_;
    if (iVar3._M_current ==
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
      ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  *)&this->corner_traversal_stack_,iVar3,&local_3c);
    }
    else {
      (iVar3._M_current)->value_ = corner_id.value_;
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    IVar13.value_ = local_3c.value_;
    if (local_3c.value_ != 0xffffffff) {
      IVar13.value_ = local_3c.value_ - 2;
      if (0x55555555 < (local_3c.value_ + 1) * -0x55555555) {
        IVar13.value_ = local_3c.value_ + 1;
      }
    }
    pCVar4 = (this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).corner_table_;
    if (IVar13.value_ == 0xffffffff) {
      uVar14 = 0xffffffff;
    }
    else {
      uVar14 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[IVar13.value_].value_;
    }
    IVar13.value_ = local_3c.value_;
    if (local_3c.value_ != 0xffffffff) {
      IVar13.value_ = ((local_3c.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_3c.value_;
    }
    if (IVar13.value_ == 0xffffffff) {
      uVar12 = 0xffffffff;
    }
    else {
      uVar12 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[IVar13.value_].value_;
    }
    if ((int)uVar14 == -1) {
      return false;
    }
    if ((int)uVar12 == -1) {
      return false;
    }
    p_Var5 = (this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar6 = p_Var5[uVar14 >> 6];
    if ((uVar6 >> (uVar14 & 0x3f) & 1) == 0) {
      p_Var5[uVar14 >> 6] = uVar6 | 1L << ((byte)uVar14 & 0x3f);
      local_40.value_ = local_3c.value_;
      if (local_3c.value_ != 0xffffffff) {
        local_40.value_ = local_3c.value_ - 2;
        if (0x55555555 < (local_3c.value_ + 1) * -0x55555555) {
          local_40.value_ = local_3c.value_ + 1;
        }
      }
      PointsSequencer::AddPointId
                ((this->
                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ).traversal_observer_.sequencer_,
                 (PointIndex)
                 (((this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).traversal_observer_.mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(ulong)local_40.value_ / 3]._M_elems
                 [local_40.value_ % 3].value_);
      pMVar7 = (this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.encoding_data_;
      iVar3._M_current =
           (pMVar7->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pMVar7->encoded_attribute_value_index_to_corner_map).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                  ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)pMVar7,iVar3,&local_40);
      }
      else {
        (iVar3._M_current)->value_ = local_40.value_;
        (pMVar7->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      pMVar7 = (this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.encoding_data_;
      (pMVar7->vertex_to_encoded_attribute_value_index_map).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar14]
           = pMVar7->num_values;
      pMVar7->num_values = pMVar7->num_values + 1;
    }
    p_Var5 = (this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar14 = p_Var5[uVar12 >> 6];
    if ((uVar14 >> (uVar12 & 0x3f) & 1) == 0) {
      p_Var5[uVar12 >> 6] = uVar14 | 1L << ((byte)uVar12 & 0x3f);
      local_40.value_ = local_3c.value_;
      if (local_3c.value_ != 0xffffffff) {
        local_40.value_ = ((local_3c.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_3c.value_;
      }
      PointsSequencer::AddPointId
                ((this->
                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ).traversal_observer_.sequencer_,
                 (PointIndex)
                 (((this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).traversal_observer_.mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(ulong)local_40.value_ / 3]._M_elems
                 [local_40.value_ % 3].value_);
      pMVar7 = (this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.encoding_data_;
      iVar3._M_current =
           (pMVar7->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pMVar7->encoded_attribute_value_index_to_corner_map).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                  ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)pMVar7,iVar3,&local_40);
      }
      else {
        (iVar3._M_current)->value_ = local_40.value_;
        (pMVar7->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      pMVar7 = (this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.encoding_data_;
      (pMVar7->vertex_to_encoded_attribute_value_index_map).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar12]
           = pMVar7->num_values;
      pMVar7->num_values = pMVar7->num_values + 1;
    }
    pIVar9 = (this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)&this->corner_traversal_stack_;
    if ((this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pIVar9) {
      do {
        local_3c.value_ = pIVar9[-1].value_;
        if ((local_3c.value_ == 0xffffffff) ||
           (uVar14 = (ulong)local_3c.value_ / 3,
           (*(ulong *)((long)(this->
                             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                             ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                      (ulong)(local_3c.value_ / 0x18 & 0xfffffff8)) >> (uVar14 & 0x3f) & 1) != 0)) {
          (this->corner_traversal_stack_).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pIVar9 + -1;
          iVar11 = 0;
        }
        else {
          do {
            puVar2 = (this->
                     super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                     ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar14 >> 6)
            ;
            *puVar2 = *puVar2 | 1L << ((byte)uVar14 & 0x3f);
            pCVar4 = (this->
                     super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                     ).corner_table_;
            if ((ulong)local_3c.value_ == 0xffffffff) {
              uVar12 = 0xffffffff;
            }
            else {
              uVar12 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                              super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_3c.value_].value_;
            }
            if ((int)uVar12 == -1) {
              iVar11 = 1;
            }
            else {
              p_Var5 = (this->
                       super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                       ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              uVar6 = p_Var5[uVar12 >> 6];
              uVar15 = uVar14;
              if ((uVar6 >> (uVar12 & 0x3f) & 1) == 0) {
                uVar8 = (pCVar4->vertex_corners_).vector_.
                        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar12].value_;
                uVar10 = uVar8;
                if (uVar8 != 0xffffffff) {
                  uVar10 = uVar8 - 2;
                  if (0x55555555 < (uVar8 + 1) * -0x55555555) {
                    uVar10 = uVar8 + 1;
                  }
                }
                if (uVar10 != 0xffffffff) {
                  uVar10 = (pCVar4->opposite_corners_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
                }
                if (uVar10 == 0xffffffff) {
                  bVar16 = true;
                }
                else {
                  iVar11 = uVar10 - 2;
                  if (0x55555555 < (uVar10 + 1) * -0x55555555) {
                    iVar11 = uVar10 + 1;
                  }
                  bVar16 = iVar11 == -1;
                }
                p_Var5[uVar12 >> 6] = uVar6 | 1L << ((byte)uVar12 & 0x3f);
                local_40.value_ = local_3c.value_;
                PointsSequencer::AddPointId
                          ((this->
                           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                           ).traversal_observer_.sequencer_,
                           (PointIndex)
                           (((this->
                             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                             ).traversal_observer_.mesh_)->faces_).vector_.
                           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(ulong)local_3c.value_ / 3].
                           _M_elems[local_3c.value_ % 3].value_);
                pMVar7 = (this->
                         super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                         ).traversal_observer_.encoding_data_;
                iVar3._M_current =
                     (pMVar7->encoded_attribute_value_index_to_corner_map).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (pMVar7->encoded_attribute_value_index_to_corner_map).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  ::
                  _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                            ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                              *)pMVar7,iVar3,&local_40);
                }
                else {
                  (iVar3._M_current)->value_ = local_40.value_;
                  (pMVar7->encoded_attribute_value_index_to_corner_map).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                pMVar7 = (this->
                         super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                         ).traversal_observer_.encoding_data_;
                (pMVar7->vertex_to_encoded_attribute_value_index_map).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar12] = pMVar7->num_values;
                pMVar7->num_values = pMVar7->num_values + 1;
                iVar11 = 0;
                if (!bVar16) {
                  if (local_3c.value_ == 0xffffffff) {
                    local_3c.value_ = 0xffffffff;
                  }
                  else {
                    uVar8 = local_3c.value_ + 1;
                    local_3c.value_ = local_3c.value_ - 2;
                    if (0x55555555 < uVar8 * -0x55555555) {
                      local_3c.value_ = uVar8;
                    }
                    if (local_3c.value_ != 0xffffffff) {
                      local_3c.value_ =
                           (((this->
                             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                             ).corner_table_)->opposite_corners_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_3c.value_].value_;
                    }
                  }
                  uVar14 = (ulong)local_3c.value_ / 3;
                  iVar11 = 4;
                }
                uVar15 = uVar14;
                if (!bVar16) goto LAB_0012ce51;
              }
              pCVar4 = (this->
                       super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                       ).corner_table_;
              uVar8 = 0xffffffff;
              local_40.value_ = 0xffffffff;
              if (local_3c.value_ != 0xffffffff) {
                local_40.value_ = local_3c.value_ - 2;
                if (0x55555555 < (local_3c.value_ + 1) * -0x55555555) {
                  local_40.value_ = local_3c.value_ + 1;
                }
                if (local_40.value_ != 0xffffffff) {
                  local_40.value_ =
                       (pCVar4->opposite_corners_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_40.value_].value_;
                }
              }
              if ((local_3c.value_ != 0xffffffff) &&
                 (uVar8 = ((local_3c.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_3c.value_,
                 uVar8 != 0xffffffff)) {
                uVar8 = (pCVar4->opposite_corners_).vector_.
                        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
              }
              uVar14 = (ulong)local_40.value_ / 3;
              uVar12 = (ulong)uVar8 / 3;
              if (uVar8 == 0xffffffff) {
                uVar12 = 0xffffffff;
              }
              if ((local_40.value_ == 0xffffffff) ||
                 (((this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >>
                   (uVar14 & 0x3f) & 1) != 0)) {
                if ((uVar8 == 0xffffffff) ||
                   (((this->
                     super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                     ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar12 >> 6] >>
                     (uVar12 & 0x3f) & 1) != 0)) {
                  ppIVar1 = &(this->corner_traversal_stack_).
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppIVar1 = *ppIVar1 + -1;
                  goto LAB_0012ce18;
                }
                iVar11 = 0;
                uVar14 = uVar12;
                local_3c.value_ = uVar8;
              }
              else if ((uVar8 == 0xffffffff) ||
                      (((this->
                        super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                        ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar12 >> 6]
                        >> (uVar12 & 0x3f) & 1) != 0)) {
                iVar11 = 0;
                local_3c.value_ = local_40.value_;
              }
              else {
                iVar3._M_current =
                     (this->corner_traversal_stack_).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                iVar3._M_current[-1].value_ = uVar8;
                if (iVar3._M_current ==
                    (this->corner_traversal_stack_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  ::
                  _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                            (local_38,iVar3,&local_40);
                }
                else {
                  (iVar3._M_current)->value_ = local_40.value_;
                  (this->corner_traversal_stack_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
LAB_0012ce18:
                iVar11 = 5;
                uVar14 = uVar15;
              }
            }
LAB_0012ce51:
          } while ((iVar11 == 0) || (iVar11 == 4));
          if (iVar11 == 5) {
            iVar11 = 0;
          }
        }
        if (iVar11 != 0) {
          return false;
        }
        pIVar9 = (this->corner_traversal_stack_).
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while ((this->corner_traversal_stack_).
               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start != pIVar9);
    }
  }
  return true;
}

Assistant:

bool TraverseFromCorner(CornerIndex corner_id) {
    if (this->IsFaceVisited(corner_id)) {
      return true;  // Already traversed.
    }

    corner_traversal_stack_.clear();
    corner_traversal_stack_.push_back(corner_id);
    // For the first face, check the remaining corners as they may not be
    // processed yet.
    const VertexIndex next_vert =
        this->corner_table()->Vertex(this->corner_table()->Next(corner_id));
    const VertexIndex prev_vert =
        this->corner_table()->Vertex(this->corner_table()->Previous(corner_id));
    if (next_vert == kInvalidVertexIndex || prev_vert == kInvalidVertexIndex) {
      return false;
    }
    if (!this->IsVertexVisited(next_vert)) {
      this->MarkVertexVisited(next_vert);
      this->traversal_observer().OnNewVertexVisited(
          next_vert, this->corner_table()->Next(corner_id));
    }
    if (!this->IsVertexVisited(prev_vert)) {
      this->MarkVertexVisited(prev_vert);
      this->traversal_observer().OnNewVertexVisited(
          prev_vert, this->corner_table()->Previous(corner_id));
    }

    // Start the actual traversal.
    while (!corner_traversal_stack_.empty()) {
      // Currently processed corner.
      corner_id = corner_traversal_stack_.back();
      FaceIndex face_id(corner_id.value() / 3);
      // Make sure the face hasn't been visited yet.
      if (corner_id == kInvalidCornerIndex || this->IsFaceVisited(face_id)) {
        // This face has been already traversed.
        corner_traversal_stack_.pop_back();
        continue;
      }
      while (true) {
        this->MarkFaceVisited(face_id);
        this->traversal_observer().OnNewFaceVisited(face_id);
        const VertexIndex vert_id = this->corner_table()->Vertex(corner_id);
        if (vert_id == kInvalidVertexIndex) {
          return false;
        }
        if (!this->IsVertexVisited(vert_id)) {
          const bool on_boundary = this->corner_table()->IsOnBoundary(vert_id);
          this->MarkVertexVisited(vert_id);
          this->traversal_observer().OnNewVertexVisited(vert_id, corner_id);
          if (!on_boundary) {
            corner_id = this->corner_table()->GetRightCorner(corner_id);
            face_id = FaceIndex(corner_id.value() / 3);
            continue;
          }
        }
        // The current vertex has been already visited or it was on a boundary.
        // We need to determine whether we can visit any of it's neighboring
        // faces.
        const CornerIndex right_corner_id =
            this->corner_table()->GetRightCorner(corner_id);
        const CornerIndex left_corner_id =
            this->corner_table()->GetLeftCorner(corner_id);
        const FaceIndex right_face_id(
            (right_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(right_corner_id.value() / 3)));
        const FaceIndex left_face_id(
            (left_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(left_corner_id.value() / 3)));
        if (this->IsFaceVisited(right_face_id)) {
          // Right face has been already visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Both neighboring faces are visited. End reached.
            corner_traversal_stack_.pop_back();
            break;  // Break from the while (true) loop.
          } else {
            // Go to the left face.
            corner_id = left_corner_id;
            face_id = left_face_id;
          }
        } else {
          // Right face was not visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Left face visited, go to the right one.
            corner_id = right_corner_id;
            face_id = right_face_id;
          } else {
            // Both neighboring faces are unvisited, we need to visit both of
            // them.

            // Split the traversal.
            // First make the top of the current corner stack point to the left
            // face (this one will be processed second).
            corner_traversal_stack_.back() = left_corner_id;
            // Add a new corner to the top of the stack (right face needs to
            // be traversed first).
            corner_traversal_stack_.push_back(right_corner_id);
            // Break from the while (true) loop.
            break;
          }
        }
      }
    }
    return true;
  }